

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void CChat::Com_All(IResult *pResult,void *pContext)

{
  int iVar1;
  char *src;
  CChat *in_RSI;
  IResult *in_RDI;
  CChat *pChatData;
  SCommandContext *pCommandContext;
  char *dst;
  int Mode;
  CChat *this;
  
  dst = *(char **)(in_RSI->m_aInputBuf + 8);
  dst[0x25f74] = '\0';
  this = in_RSI;
  iVar1 = IConsole::IResult::NumArguments(in_RDI);
  Mode = (int)((ulong)in_RSI >> 0x20);
  if (iVar1 != 0) {
    src = dst + 0x25f74;
    (*in_RDI->_vptr_IResult[4])(in_RDI,0);
    str_copy(dst,src,0);
  }
  EnableMode(this,Mode,dst);
  return;
}

Assistant:

void CChat::Com_All(IConsole::IResult *pResult, void *pContext)
{
	CCommandManager::SCommandContext *pCommandContext = (CCommandManager::SCommandContext *)pContext;
	CChat *pChatData = (CChat *)pCommandContext->m_pContext;

	pChatData->m_aChatCmdBuffer[0] = '\0';
	if(pResult->NumArguments())
	{
		// save the parameter in a buffer before EnableMode clears it
		str_copy(pChatData->m_aChatCmdBuffer, pResult->GetString(0), sizeof(pChatData->m_aChatCmdBuffer));
	}
	pChatData->EnableMode(CHAT_ALL, pChatData->m_aChatCmdBuffer);
}